

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vfs_unregister(sqlite3_vfs *pVfs)

{
  sqlite3_mutex *p;
  sqlite3_mutex *mutex;
  sqlite3_vfs *pVfs_local;
  
  p = sqlite3MutexAlloc(2);
  sqlite3_mutex_enter(p);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(p);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_vfs_unregister(sqlite3_vfs *pVfs){
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}